

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O2

void __thiscall deqp::SubcaseBase::OutputNotSupported(SubcaseBase *this,string *reason)

{
  TestLog *this_00;
  istream *piVar1;
  string line;
  string msg;
  istringstream tokens;
  
  this_00 = ((this->super_GLWrapper).m_context)->m_testCtx->m_log;
  std::operator+(&msg,reason,", test will not run.");
  std::__cxx11::istringstream::istringstream((istringstream *)&tokens,(string *)&msg,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  tcu::TestLog::startSection(this_00,"Not supported","Reason");
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&tokens,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    tcu::TestLog::writeMessage(this_00,line._M_dataplus._M_p);
  }
  tcu::TestLog::endSection(this_00);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&tokens);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void SubcaseBase::OutputNotSupported(std::string reason)
{
	using tcu::TestLog;
	TestLog&		   log = m_context.getTestContext().getLog();
	std::string		   msg = reason + ", test will not run.";
	std::istringstream tokens(msg);
	std::string		   line;
	log.startSection("Not supported", "Reason");
	while (getline(tokens, line))
	{
		log.writeMessage(line.c_str());
	}
	log.endSection();
}